

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O0

void TwoBytesKeygen(int maxlen,KeyCallback *c)

{
  long *in_RSI;
  uint in_EDI;
  double dVar1;
  int valB;
  int valA_1;
  int byteB;
  int byteA_1;
  int keylen_1;
  int valA;
  int byteA;
  int keylen;
  uint8_t key [256];
  int i_1;
  int i;
  int keycount;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined1 local_128 [268];
  int local_1c;
  int local_18;
  uint local_14;
  long *local_10;
  uint local_4;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_4 = in_EDI;
  for (local_18 = 2; local_18 <= (int)local_4; local_18 = local_18 + 1) {
    dVar1 = chooseK(local_18,2);
    local_14 = (int)dVar1 + local_14;
  }
  local_14 = local_14 * 0xfe01;
  for (local_1c = 2; local_1c <= (int)local_4; local_1c = local_1c + 1) {
    local_14 = local_1c * 0xff + local_14;
  }
  printf("Keyset \'TwoBytes\' - up-to-%d-byte keys, %d total keys\n",(ulong)local_4,(ulong)local_14)
  ;
  (**(code **)(*local_10 + 0x18))();
  memset(local_128,0,0x100);
  for (local_12c = 2; local_12c <= (int)local_4; local_12c = local_12c + 1) {
    for (local_130 = 0; local_130 < local_12c; local_130 = local_130 + 1) {
      for (local_134 = 1; local_134 < 0x100; local_134 = local_134 + 1) {
        local_128[local_130] = (char)local_134;
        (**(code **)(*local_10 + 0x10))(local_10,local_128,local_12c);
      }
      local_128[local_130] = 0;
    }
  }
  for (local_138 = 2; local_138 <= (int)local_4; local_138 = local_138 + 1) {
    for (local_13c = 0; local_140 = local_13c, local_13c < local_138 + -1; local_13c = local_13c + 1
        ) {
      while (local_140 = local_140 + 1, local_140 < local_138) {
        for (local_144 = 1; local_144 < 0x100; local_144 = local_144 + 1) {
          local_128[local_13c] = (char)local_144;
          for (local_148 = 1; local_148 < 0x100; local_148 = local_148 + 1) {
            local_128[local_140] = (char)local_148;
            (**(code **)(*local_10 + 0x10))(local_10,local_128,local_138);
          }
          local_128[local_140] = 0;
        }
        local_128[local_13c] = 0;
      }
    }
  }
  return;
}

Assistant:

void TwoBytesKeygen ( int maxlen, KeyCallback & c )
{
  //----------
  // Compute # of keys

  int keycount = 0;

  for(int i = 2; i <= maxlen; i++) keycount += (int)chooseK(i,2);

  keycount *= 255*255;

  for(int i = 2; i <= maxlen; i++) keycount += i*255;

  printf("Keyset 'TwoBytes' - up-to-%d-byte keys, %d total keys\n", maxlen, keycount);

  c.reserve(keycount);

  //----------
  // Add all keys with one non-zero byte

  uint8_t key[256];

  memset(key,0,256);

  for(int keylen = 2; keylen <= maxlen; keylen++)
  for(int byteA = 0; byteA < keylen; byteA++)
  {
    for(int valA = 1; valA <= 255; valA++)
    {
      key[byteA] = (uint8_t)valA;

      c(key,keylen);
    }

    key[byteA] = 0;
  }

  //----------
  // Add all keys with two non-zero bytes

  for(int keylen = 2; keylen <= maxlen; keylen++)
  for(int byteA = 0; byteA < keylen-1; byteA++)
  for(int byteB = byteA+1; byteB < keylen; byteB++)
  {
    for(int valA = 1; valA <= 255; valA++)
    {
      key[byteA] = (uint8_t)valA;

      for(int valB = 1; valB <= 255; valB++)
      {
        key[byteB] = (uint8_t)valB;
        c(key,keylen);
      }

      key[byteB] = 0;
    }

    key[byteA] = 0;
  }
}